

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch.h
# Opt level: O2

Branch * testinator::Branch::currentParent(void)

{
  stack<testinator::Branch_*,_std::deque<testinator::Branch_*,_std::allocator<testinator::Branch_*>_>_>
  *psVar1;
  _Elt_pointer ppBVar2;
  
  psVar1 = getStack();
  ppBVar2 = (psVar1->c).
            super__Deque_base<testinator::Branch_*,_std::allocator<testinator::Branch_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  if (ppBVar2 ==
      (psVar1->c).super__Deque_base<testinator::Branch_*,_std::allocator<testinator::Branch_*>_>.
      _M_impl.super__Deque_impl_data._M_finish._M_first) {
    ppBVar2 = (psVar1->c).
              super__Deque_base<testinator::Branch_*,_std::allocator<testinator::Branch_*>_>._M_impl
              .super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  return ppBVar2[-1];
}

Assistant:

static Branch& currentParent()
    {
      return *getStack().top();
    }